

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  int iVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
  pVar7;
  LogFinisher local_65;
  int local_64;
  LogMessage local_60;
  _Base_ptr p_Var5;
  
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (number <= (int)p_Var5[1]._M_color) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < number];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= number)) {
      local_64 = number;
      if (*(char *)((long)&p_Var6[1]._M_left + 1) != '\0') {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x206);
        pLVar4 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                           );
        LogFinisher::operator=(&local_65,pLVar4);
        LogMessage::~LogMessage(&local_60);
      }
      bVar2 = *(byte *)&p_Var6[1]._M_left;
      if ((byte)(bVar2 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        pLVar4 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_65,pLVar4);
        LogMessage::~LogMessage(&local_60);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 10) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x206);
        pLVar4 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_65,pLVar4);
        LogMessage::~LogMessage(&local_60);
      }
      p_Var5 = p_Var6[1]._M_parent;
      if (((ulong)p_Var6[1]._M_left & 0x100000) != 0) {
        iVar3 = (*(*(_func_int ***)p_Var5)[6])(p_Var5,prototype);
        p_Var5 = (_Base_ptr)CONCAT44(extraout_var,iVar3);
        if (p_Var6[1]._M_parent != (_Base_ptr)0x0) {
          (**(code **)(*(long *)p_Var6[1]._M_parent + 8))();
        }
      }
      pVar7 = std::
              _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
              ::equal_range((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                             *)this,&local_64);
      std::
      _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
      ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                      *)this,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
      return (MessageLite *)p_Var5;
    }
  }
  return (MessageLite *)0x0;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (iter->second.is_lazy) {
      ret = iter->second.lazymessage_value->ReleaseMessage(prototype);
      delete iter->second.lazymessage_value;
    } else {
      ret = iter->second.message_value;
    }
    extensions_.erase(number);
    return ret;
  }
}